

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  bool bVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    if (0 < (int)uVar4) {
      uVar9 = 0;
      do {
        uVar2 = *(uint *)((long)*inputs + uVar9 * 4);
        bVar10 = (~uVar2 & 0x7f800000) == 0;
        bVar11 = (uVar2 & 0x7fffff) != 0;
        bVar7 = bVar11 && bVar10;
        if ((*(int *)((long)*outputs + uVar9 * 4) == 0) == bVar7) {
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          pcVar8 = "false";
          if (bVar11 && bVar10) {
            pcVar8 = "true";
          }
          uVar9 = (ulong)bVar7 ^ 5;
LAB_0046cbbd:
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,uVar9);
          return false;
        }
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
  }
  else if (0 < (int)uVar4 && PVar1 < PRECISION_HIGHP) {
    uVar9 = 0;
    do {
      uVar2 = *(uint *)((long)*inputs + uVar9 * 4);
      if (((~uVar2 & 0x7f800000) != 0 || (uVar2 & 0x7fffff) == 0) &&
         (*(int *)((long)*outputs + uVar9 * 4) != 0)) {
        poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
        pcVar8 = "false";
        uVar9 = 5;
        goto LAB_0046cbbd;
      }
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP || precision == glu::PRECISION_LOWP)
		{
			// NaN support is optional, check that inputs that are not NaN don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}

		return true;
	}